

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

uint8_t * __thiscall
cdns::dump_block_properties
          (cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version,
          int *err,FILE *F_out)

{
  long lVar1;
  byte bVar2;
  int64_t iVar3;
  byte *in_00;
  uint8_t *in_01;
  size_t __n;
  size_t __size;
  cdns *pcVar4;
  char *__ptr;
  int iVar5;
  bool bVar6;
  int64_t val;
  int64_t inner_val;
  char *p_out;
  int64_t local_40;
  cdns *local_38;
  
  bVar2 = *in;
  local_38 = this;
  in_00 = cbor_get_number(in,in_max,&val);
  if (bVar2 >> 5 == 5 && in_00 != (byte *)0x0) {
    fwrite("        [\n",10,1,(FILE *)F_out);
    iVar3 = val;
    if (val == -1) {
      val = 0xffffffff;
    }
    if (in_00 < in_max && 0 < val) {
      local_40 = iVar3;
      iVar5 = 0;
      do {
        bVar2 = *in_00;
        if (bVar2 == 0xff) {
          fwrite("\n            --end of array",0x1b,1,(FILE *)F_out);
          if (local_40 != -1) {
            fwrite("            Error, end of array mark unexpected.\n",0x31,1,(FILE *)F_out);
            *err = -3;
            return (uint8_t *)0x0;
          }
          in_00 = in_00 + 1;
          goto LAB_00155e06;
        }
        in_01 = cbor_get_number(in_00,in_max,&inner_val);
        if (0x1f < bVar2) {
          fprintf((FILE *)F_out,"            Unexpected type: %d(%d)\n",(ulong)(bVar2 >> 5),
                  (ulong)(uint)inner_val);
          *err = -3;
          return (uint8_t *)0x0;
        }
        bVar6 = iVar5 != 0;
        iVar5 = iVar5 + -1;
        if (bVar6) {
          fwrite(",\n",2,1,(FILE *)F_out);
        }
        fprintf((FILE *)F_out,"            %d, ",(ulong)(uint)inner_val);
        lVar1 = CONCAT44(inner_val._4_4_,(uint)inner_val);
        if (lVar1 == 4) {
          pcVar4 = (cdns *)0x16967e;
          fwrite("[\n",2,1,(FILE *)F_out);
          in_00 = dump_list(pcVar4,in_01,in_max,out_buf,out_max,"                ",
                            "address-event-counts",err,F_out);
LAB_00155d16:
          __size = 0xd;
          __n = 1;
          __ptr = "            ]";
LAB_00155d5e:
          fwrite(__ptr,__size,__n,(FILE *)F_out);
        }
        else {
          if (lVar1 == 3) {
            pcVar4 = (cdns *)0x16967e;
            fwrite("[\n",2,1,(FILE *)F_out);
            in_00 = dump_queries(pcVar4,in_01,in_max,out_buf,out_max,cdns_version,err,F_out);
            goto LAB_00155d16;
          }
          if (lVar1 != 2) {
            p_out = out_buf;
            in_00 = cbor_to_text(in_01,in_max,&p_out,out_max,err);
            __n = (long)p_out - (long)out_buf;
            __size = 1;
            __ptr = out_buf;
            goto LAB_00155d5e;
          }
          in_00 = dump_block_tables(local_38,in_01,in_max,out_buf,out_max,cdns_version,err,F_out);
        }
        lVar1 = val + -1;
      } while (((in_00 < in_max) && (in_00 != (byte *)0x0)) && (bVar6 = 1 < val, val = lVar1, bVar6)
              );
      val = lVar1;
      if (in_00 == (byte *)0x0) {
        return (uint8_t *)0x0;
      }
    }
LAB_00155e06:
    fwrite("\n        ]\n",0xb,1,(FILE *)F_out);
  }
  else {
    in_00 = (byte *)0x0;
    fprintf((FILE *)F_out,"   Error, cannot parse the first bytes of properties, type: %d.\n",
            (ulong)(bVar2 >> 5));
    *err = -3;
  }
  return in_00;
}

Assistant:

uint8_t* cdns::dump_block_properties(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_MAP) {
        fprintf(F_out, "   Error, cannot parse the first bytes of properties, type: %d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;
        fprintf(F_out, "        [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max ) {
            if (*in == 0xff) {
                fprintf(F_out, "\n            --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "            Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                /* There should be two elements for each map item */
                int inner_type = CBOR_CLASS(*in);
                int64_t inner_val;

                in = cbor_get_number(in, in_max, &inner_val);
                if (inner_type != CBOR_T_UINT) {
                    fprintf(F_out, "            Unexpected type: %d(%d)\n", inner_type, (int)inner_val);
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else {
                    if (rank != 0) {
                        fprintf(F_out, ",\n");
                    }
                    rank++;
                    fprintf(F_out, "            %d, ", (int)inner_val);
                    if (inner_val == 2) {
                        in = dump_block_tables(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                    }
                    else if (inner_val == 3) {
                        fprintf(F_out, "[\n");
                        in = dump_queries(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else if (inner_val == 4) {
                        fprintf(F_out, "[\n");
                        in = dump_list(in, in_max, out_buf, out_max, "                ", "address-event-counts", err, F_out);
                        fprintf(F_out, "            ]");
                    }
                    else {
                        p_out = out_buf;
                        in = cbor_to_text(in, in_max, &p_out, out_max, err);
                        fwrite(out_buf, 1, p_out - out_buf, F_out);
                    }
                    val--;
                }
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n        ]\n");
        }
    }

    return in;
}